

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ly_common.c
# Opt level: O0

LY_ERR lys_parse_id(char **id)

{
  bool bVar1;
  char **id_local;
  
  if ((id != (char **)0x0) && (*id != (char *)0x0)) {
    if ((((**id < 'a') || ('z' < **id)) && ((**id < 'A' || ('Z' < **id)))) && (**id != '_')) {
      id_local._4_4_ = LY_EINVAL;
    }
    else {
      *id = *id + 1;
      while( true ) {
        if ((((**id < 'a') || (bVar1 = true, 'z' < **id)) &&
            ((**id < 'A' || (bVar1 = true, 'Z' < **id)))) &&
           ((((**id < '0' || (bVar1 = true, '9' < **id)) && (bVar1 = true, **id != '_')) &&
            (bVar1 = true, **id != '-')))) {
          bVar1 = **id == '.';
        }
        if (!bVar1) break;
        *id = *id + 1;
      }
      id_local._4_4_ = LY_SUCCESS;
    }
    return id_local._4_4_;
  }
  __assert_fail("id && *id",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/ly_common.c"
                ,0x32b,"LY_ERR lys_parse_id(const char **)");
}

Assistant:

static LY_ERR
lys_parse_id(const char **id)
{
    assert(id && *id);

    if (!is_yangidentstartchar(**id)) {
        return LY_EINVAL;
    }
    ++(*id);

    while (is_yangidentchar(**id)) {
        ++(*id);
    }
    return LY_SUCCESS;
}